

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool __thiscall
duckdb::TryCastToBit::Operation<duckdb::string_t,duckdb::string_t>
          (TryCastToBit *this,string_t input,string_t *result,Vector *result_vector,
          CastParameters *parameters)

{
  bool bVar1;
  ulong uVar2;
  element_type *output_str;
  anon_union_16_2_67f50693_for_value *paVar3;
  idx_t len;
  anon_struct_16_3_d7536bce_for_pointer aVar4;
  string_t str;
  idx_t result_size;
  Vector *local_30;
  
  paVar3 = input.value._8_8_;
  str.value._0_8_ = input.value._0_8_;
  output_str = (result_vector->type).type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  str.value.pointer.ptr = (char *)&local_30;
  bVar1 = Bit::TryGetBitStringSize((Bit *)this,str,(idx_t *)output_str,(string *)result_vector);
  if (bVar1) {
    aVar4 = (anon_struct_16_3_d7536bce_for_pointer)
            StringVector::EmptyString((StringVector *)result,local_30,len);
    paVar3->pointer = aVar4;
    Bit::ToBit((Bit *)this,input,(bitstring_t *)output_str);
    uVar2 = (ulong)(paVar3->pointer).length;
    if (uVar2 < 0xd) {
      switchD_010444a0::default((void *)((long)paVar3 + uVar2 + 4),0,0xc - uVar2);
    }
    else {
      *(undefined4 *)(paVar3->pointer).prefix = *(undefined4 *)(paVar3->pointer).ptr;
    }
  }
  return bVar1;
}

Assistant:

bool TryCastToBit::Operation(string_t input, string_t &result, Vector &result_vector, CastParameters &parameters) {
	idx_t result_size;
	if (!Bit::TryGetBitStringSize(input, result_size, parameters.error_message)) {
		return false;
	}

	result = StringVector::EmptyString(result_vector, result_size);
	Bit::ToBit(input, result);
	result.Finalize();
	return true;
}